

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<true,_false,_true>::~SimplifyLocals(SimplifyLocals<true,_false,_true> *this)

{
  ~SimplifyLocals(this);
  operator_delete(this,0x368);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }